

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall ACSStringPool::AddString(ACSStringPool *this,char *str)

{
  DWORD h;
  uint uVar1;
  size_t len;
  FString fstr;
  FString local_30;
  
  len = strlen(str);
  h = SuperFastHash(str,len);
  uVar1 = FindString(this,str,len,h,h % 0xfb);
  if ((int)uVar1 < 0) {
    FString::FString(&local_30,str);
    uVar1 = InsertString(this,&local_30,h,h % 0xfb);
    FString::~FString(&local_30);
  }
  else {
    uVar1 = uVar1 | 0x7ff00000;
  }
  return uVar1;
}

Assistant:

int ACSStringPool::AddString(const char *str)
{
	size_t len = strlen(str);
	unsigned int h = SuperFastHash(str, len);
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, len, h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	FString fstr(str);
	return InsertString(fstr, h, bucketnum);
}